

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void pbrt::ParseFiles(ParserTarget *target,
                     span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     filenames)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> t_1;
  string *fn;
  iterator __end2;
  iterator __begin2;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range2;
  unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> t;
  anon_class_1_0_00000001 tokError;
  function<void_(const_char_*,_const_pbrt::FileLoc_*)> *in_stack_000001e0;
  string *in_stack_000001e8;
  unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *in_stack_00002238;
  ParserTarget *in_stack_00002240;
  unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  anon_class_1_0_00000001 *in_stack_fffffffffffffec8;
  function<void_(const_char_*,_const_pbrt::FileLoc_*)> *in_stack_fffffffffffffed0;
  allocator<char> *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  anon_class_1_0_00000001 local_f8 [24];
  string *in_stack_ffffffffffffff20;
  string local_c8 [32];
  iterator local_a8;
  iterator local_a0;
  iterator local_98;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_90;
  undefined1 local_49 [49];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  
  local_18 = in_RDI;
  bVar1 = pstd::
          span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::empty((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x7596ac);
  if (bVar1) {
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    std::function<void(char_const*,pbrt::FileLoc_const*)>::
    function<pbrt::ParseFiles(pbrt::ParserTarget*,pstd::span<std::__cxx11::string_const>)::__0&,void>
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    Tokenizer::CreateFromFile(in_stack_000001e8,in_stack_000001e0);
    std::function<void_(const_char_*,_const_pbrt::FileLoc_*)>::~function
              ((function<void_(const_char_*,_const_pbrt::FileLoc_*)> *)0x759725);
    std::__cxx11::string::~string((string *)(local_49 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_49);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)
                       0x75974c);
    if (bVar1) {
      std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::unique_ptr
                ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)
                 in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      parse(in_stack_00002240,in_stack_00002238);
      std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::~unique_ptr
                ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)
                 in_stack_fffffffffffffec0);
    }
    std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::~unique_ptr
              ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)
               in_stack_fffffffffffffec0);
  }
  else {
    local_90 = &local_10;
    local_98 = pstd::
               span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::begin(local_90);
    local_a0 = pstd::
               span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::end(local_90);
    for (; local_98 != local_a0; local_98 = local_98 + 1) {
      local_a8 = local_98;
      bVar1 = std::operator!=(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
      if (bVar1) {
        std::__cxx11::string::string(local_c8,(string *)local_a8);
        SetSearchDirectory(in_stack_ffffffffffffff20);
        std::__cxx11::string::~string(local_c8);
      }
      std::function<void(char_const*,pbrt::FileLoc_const*)>::
      function<pbrt::ParseFiles(pbrt::ParserTarget*,pstd::span<std::__cxx11::string_const>)::__0&,void>
                ((function<void_(const_char_*,_const_pbrt::FileLoc_*)> *)local_a8,
                 in_stack_fffffffffffffec8);
      Tokenizer::CreateFromFile(in_stack_000001e8,in_stack_000001e0);
      std::function<void_(const_char_*,_const_pbrt::FileLoc_*)>::~function
                ((function<void_(const_char_*,_const_pbrt::FileLoc_*)> *)0x759953);
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)
                         0x75995d);
      if (bVar1) {
        in_stack_fffffffffffffec8 = local_f8;
        in_stack_fffffffffffffec0 = local_18;
        std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::unique_ptr
                  ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)local_18,
                   in_stack_fffffffffffffeb8);
        parse(in_stack_00002240,in_stack_00002238);
        std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::~unique_ptr
                  ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)
                   in_stack_fffffffffffffec0);
      }
      std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::~unique_ptr
                ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)
                 in_stack_fffffffffffffec0);
    }
  }
  (**(code **)(*(long *)local_18 + 0x140))();
  return;
}

Assistant:

void ParseFiles(ParserTarget *target, pstd::span<const std::string> filenames) {
    auto tokError = [](const char *msg, const FileLoc *loc) {
        ErrorExit(loc, "%s", msg);
    };

    // Process scene description
    if (filenames.empty()) {
        // Parse scene from standard input
        std::unique_ptr<Tokenizer> t = Tokenizer::CreateFromFile("-", tokError);
        if (t)
            parse(target, std::move(t));
    } else {
        // Parse scene from input files
        for (const std::string &fn : filenames) {
            if (fn != "-")
                SetSearchDirectory(fn);

            std::unique_ptr<Tokenizer> t = Tokenizer::CreateFromFile(fn, tokError);
            if (t)
                parse(target, std::move(t));
        }
    }

    target->EndOfFiles();
}